

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ActivationParametricSoftplus::SerializeWithCachedSizes
          (ActivationParametricSoftplus *this,CodedOutputStream *output)

{
  if (this->alpha_ != (WeightParams *)0x0 &&
      this != (ActivationParametricSoftplus *)&_ActivationParametricSoftplus_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->alpha_->super_MessageLite,output);
  }
  if (this->beta_ != (WeightParams *)0x0 &&
      this != (ActivationParametricSoftplus *)&_ActivationParametricSoftplus_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->beta_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void ActivationParametricSoftplus::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ActivationParametricSoftplus)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.WeightParams alpha = 1;
  if (this->has_alpha()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->alpha_, output);
  }

  // .CoreML.Specification.WeightParams beta = 2;
  if (this->has_beta()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->beta_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ActivationParametricSoftplus)
}